

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VCCluster::delItem(VCCluster *this,VCFace *f)

{
  iterator __position;
  VCFace *local_38;
  Vector3d *local_30;
  Vector3d *local_28;
  double local_20;
  
  local_38 = f;
  __position = std::
               _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
               ::find(&(this->items)._M_t,&local_38);
  if ((_Rb_tree_header *)__position._M_node != &(this->items)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>::
    erase_abi_cxx11_((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                      *)&this->items,(const_iterator)__position._M_node);
    this->area = this->area - local_38->area;
    local_30 = &this->weightedSum;
    local_20 = local_38->area;
    local_28 = &local_38->center;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_30,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_30);
    local_38->cluster = (VCCluster *)0x0;
    Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)&this->E,
               (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_38->E);
    (*this->_vptr_VCCluster[1])(this,local_38);
  }
  return;
}

Assistant:

void VCCluster::delItem(VCFace* f) {
	auto it = items.find(f);
	if (it != items.end()) {
		items.erase(it);
		area -= f->area;
		weightedSum = weightedSum - f->center * f->area;
		f->cluster = NULL;
		E -= f->E;
		delItemAdditionalAct(f);
	}
}